

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O0

int light_close_stream(light_pcapng_stream pcapng)

{
  void *in_RDI;
  light_pcapng unaff_retaddr;
  undefined4 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = -5;
  }
  else {
    if (*(long *)((long)in_RDI + 8) != 0) {
      light_pcapng_release(unaff_retaddr);
      *(undefined8 *)((long)in_RDI + 8) = 0;
    }
    light_close((__fd_t)0x1028df);
    *(undefined4 *)((long)in_RDI + 0x10) = 0;
    free(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int light_close_stream(light_pcapng_stream pcapng)
{
	if (pcapng == NULL) {
		return LIGHT_BAD_STREAM;
	}

	if (pcapng->current_block) {
		light_pcapng_release(pcapng->current_block);
		pcapng->current_block = NULL;
	}

	light_close(pcapng->stream.fd);
	pcapng->valid = 0;
	free(pcapng);

	return LIGHT_SUCCESS;
}